

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_GetCVar(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                     VMReturn *ret,int numret)

{
  AActor *activator;
  PClass *pPVar1;
  int iVar2;
  float fVar3;
  undefined4 extraout_var;
  PClass *pPVar4;
  FBaseCVar *pFVar5;
  undefined4 extraout_var_00;
  char *pcVar6;
  bool bVar7;
  FString cvarname;
  FString local_38;
  undefined8 local_30;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numret < 1) {
    return 0;
  }
  if (ret == (VMReturn *)0x0) {
    __assert_fail("ret != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x28a,"int AF_AActor_GetCVar(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (numparam < 1) {
    pcVar6 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      activator = (AActor *)(param->field_0).field_1.a;
      if (activator != (AActor *)0x0) {
        if ((activator->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar2 = (**(activator->super_DThinker).super_DObject._vptr_DObject)(activator);
          (activator->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar2);
        }
        pPVar4 = (activator->super_DThinker).super_DObject.Class;
        bVar7 = pPVar4 != (PClass *)0x0;
        if (pPVar4 != pPVar1 && bVar7) {
          do {
            pPVar4 = pPVar4->ParentClass;
            bVar7 = pPVar4 != (PClass *)0x0;
            if (pPVar4 == pPVar1) break;
          } while (pPVar4 != (PClass *)0x0);
        }
        if (!bVar7) {
          pcVar6 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003c5fd8;
        }
      }
      if (numparam == 1) {
        pcVar6 = "(paramnum) < numparam";
      }
      else {
        if (param[1].field_0.field_3.Type == '\x02') {
          FString::AttachToOther(&local_38,(FString *)(param + 1));
          pFVar5 = GetCVar(activator,local_38.Chars);
          if (pFVar5 == (FBaseCVar *)0x0) {
            if (ret->RegType != '\x01') goto LAB_003c5fb2;
            *(undefined8 *)ret->Location = 0;
          }
          else {
            fVar3 = (float)(*pFVar5->_vptr_FBaseCVar[4])(pFVar5,2);
            local_30 = CONCAT44(extraout_var_00,fVar3);
            if (ret->RegType != '\x01') {
LAB_003c5fb2:
              __assert_fail("RegType == REGT_FLOAT",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                            ,0x144,"void VMReturn::SetFloat(double)");
            }
            *(double *)ret->Location = (double)fVar3;
          }
          FString::~FString(&local_38);
          return 1;
        }
        pcVar6 = "param[paramnum].Type == REGT_STRING";
      }
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x28c,
                    "int AF_AActor_GetCVar(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pcVar6 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003c5fd8:
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x28b,"int AF_AActor_GetCVar(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, GetCVar)
{
	if (numret > 0)
	{
		assert(ret != nullptr);
		PARAM_SELF_PROLOGUE(AActor);
		PARAM_STRING(cvarname);

		FBaseCVar *cvar = GetCVar(self, cvarname);
		if (cvar == nullptr)
		{
			ret->SetFloat(0);
		}
		else
		{
			ret->SetFloat(cvar->GetGenericRep(CVAR_Float).Float);
		}
		return 1;
	}
	return 0;
}